

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

SampledSpectrum __thiscall
pbrt::ProjectionLight::I(ProjectionLight *this,Vector3f w,SampledWavelengths *lambda)

{
  Point2<float> p;
  Vector3<float> v;
  array<float,_4> aVar1;
  bool bVar2;
  Tuple2<pbrt::Point2,_float> p_00;
  array<pbrt::WrapMode,_2> wrapMode;
  int c_00;
  Float *pFVar3;
  long in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar9 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  float in_XMM1_Da;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  SampledSpectrum SVar13;
  Point3<float> PVar14;
  RGB RVar15;
  Tuple3<pbrt::Point3,_float> in_stack_00000010;
  RGBIlluminantSpectrum s;
  int c;
  RGB rgb;
  Point2f uv;
  Point3f ps;
  float in_stack_fffffffffffffe68;
  Float in_stack_fffffffffffffe6c;
  Tuple2<pbrt::Vector2,_float> in_stack_fffffffffffffe70;
  Float a;
  float in_stack_fffffffffffffe78;
  float in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  float in_stack_fffffffffffffe84;
  int iVar16;
  Float in_stack_fffffffffffffe94;
  Float FVar17;
  undefined4 uVar18;
  RGBIlluminantSpectrum *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeec;
  RGB in_stack_ffffffffffffff0c;
  int local_c8;
  RGBIlluminantSpectrum *local_c4;
  Float local_bc;
  undefined8 local_b0;
  Tuple2<pbrt::Point2,_float> local_a0;
  undefined8 local_98;
  float local_90;
  undefined8 local_88;
  undefined4 local_80;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_5c;
  undefined4 local_54;
  undefined8 local_50;
  float local_48;
  undefined8 local_2c;
  undefined8 local_1c;
  undefined8 local_10;
  Transform *in_stack_fffffffffffffff8;
  undefined1 auVar6 [64];
  undefined1 extraout_var [56];
  undefined1 auVar12 [56];
  
  local_78 = vmovlpd_avx(in_ZMM0._0_16_);
  FVar17 = (Float)in_RDI;
  uVar18 = (undefined4)((ulong)in_RDI >> 0x20);
  local_2c = local_78;
  local_1c = local_78;
  if (*(float *)(in_RDI + 0x14c) <= in_XMM1_Da) {
    p_00 = (Tuple2<pbrt::Point2,_float>)(in_RDI + 0x150);
    v.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffe80;
    v.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffffe7c;
    v.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffe84;
    local_68 = local_78;
    Point3<float>::Point3<float>((Point3<float> *)0x8bc58c,v);
    local_80 = local_54;
    local_88 = local_5c;
    auVar9 = ZEXT856(0);
    PVar14 = Transform::operator()(in_stack_fffffffffffffff8,in_stack_00000010);
    local_90 = PVar14.super_Tuple3<pbrt::Point3,_float>.z;
    auVar4._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar4._8_56_ = auVar9;
    local_98 = vmovlpd_avx(auVar4._0_16_);
    local_50 = local_98;
    local_48 = local_90;
    Point2<float>::Point2
              ((Point2<float> *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
               in_stack_fffffffffffffe68);
    bVar2 = Inside<float>((Point2<float>)local_a0,
                          (Bounds2<float> *)(CONCAT44(uVar18,FVar17) + 0x13c));
    if (bVar2) {
      wrapMode.values = (WrapMode  [2])(CONCAT44(uVar18,FVar17) + 0x13c);
      Point2<float>::Point2
                ((Point2<float> *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                 in_stack_fffffffffffffe68);
      p.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffe7c;
      p.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffe78;
      auVar5._0_8_ = Bounds2<float>::Offset(in_stack_fffffffffffffe70,p);
      auVar5._8_56_ = extraout_var;
      local_b0 = vmovlpd_avx(auVar5._0_16_);
      Point2<float>::Point2<float>
                ((Point2<float> *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                 (Vector2<float>)in_stack_fffffffffffffe70);
      RGB::RGB((RGB *)&local_c4);
      for (local_c8 = 0; local_c8 < 3; local_c8 = local_c8 + 1) {
        c_00 = (int)((ulong)(CONCAT44(uVar18,FVar17) + 0x98) >> 0x20);
        iVar16 = local_c8;
        WrapMode2D::WrapMode2D
                  ((WrapMode2D *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   (WrapMode)in_stack_fffffffffffffe7c);
        in_stack_fffffffffffffe94 =
             Image::LookupNearestChannel
                       ((Image *)CONCAT44(in_stack_fffffffffffffe94,iVar16),(Point2f)p_00,c_00,
                        (WrapMode2D)wrapMode.values);
        pFVar3 = RGB::operator[]((RGB *)&local_c4,local_c8);
        *pFVar3 = in_stack_fffffffffffffe94;
      }
      a = (Float)((ulong)*(undefined8 *)(CONCAT44(uVar18,FVar17) + 0x130) >> 0x20);
      auVar9 = ZEXT856(0);
      RVar15.b = FVar17;
      RVar15.r = p_00.x;
      RVar15.g = p_00.y;
      RVar15 = ClampZero(RVar15);
      auVar6._0_8_ = RVar15._0_8_;
      auVar6._8_56_ = auVar9;
      vmovlpd_avx(auVar6._0_16_);
      auVar12 = (undefined1  [56])0x0;
      RGBIlluminantSpectrum::RGBIlluminantSpectrum
                (local_c4,(RGBColorSpace *)CONCAT44(in_stack_fffffffffffffeec,local_bc),
                 in_stack_ffffffffffffff0c);
      auVar9 = (undefined1  [56])0x0;
      SVar13 = RGBIlluminantSpectrum::Sample
                         (in_stack_fffffffffffffeb0,(SampledWavelengths *)CONCAT44(uVar18,FVar17));
      auVar10._0_8_ = SVar13.values.values._8_8_;
      auVar10._8_56_ = auVar12;
      auVar7._0_8_ = SVar13.values.values._0_8_;
      auVar7._8_56_ = auVar9;
      auVar9 = (undefined1  [56])0x0;
      vmovlpd_avx(auVar7._0_16_);
      vmovlpd_avx(auVar10._0_16_);
      SVar13 = pbrt::operator*(a,(SampledSpectrum *)
                                 CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      auVar11._0_8_ = SVar13.values.values._8_8_;
      auVar11._8_56_ = auVar12;
      auVar8._0_8_ = SVar13.values.values._0_8_;
      auVar8._8_56_ = auVar9;
      local_10 = vmovlpd_avx(auVar8._0_16_);
      in_stack_fffffffffffffff8 = (Transform *)vmovlpd_avx(auVar11._0_16_);
    }
    else {
      SampledSpectrum::SampledSpectrum
                ((SampledSpectrum *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
    }
  }
  else {
    SampledSpectrum::SampledSpectrum
              ((SampledSpectrum *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
  }
  aVar1.values._8_8_ = in_stack_fffffffffffffff8;
  aVar1.values[0] = (float)(undefined4)local_10;
  aVar1.values[1] = (float)local_10._4_4_;
  return (array<float,_4>)(array<float,_4>)aVar1.values;
}

Assistant:

PBRT_CPU_GPU SampledSpectrum ProjectionLight::I(Vector3f w, const SampledWavelengths &lambda) const {
    // Discard directions behind projection light
    if (w.z < hither)
        return SampledSpectrum(0.f);

    // Project point onto projection plane and compute RGB
    Point3f ps = screenFromLight(Point3f(w));
    if (!Inside(Point2f(ps.x, ps.y), screenBounds))
        return SampledSpectrum(0.f);
    Point2f uv = Point2f(screenBounds.Offset(Point2f(ps.x, ps.y)));
    RGB rgb;
    for (int c = 0; c < 3; ++c)
        rgb[c] = image.LookupNearestChannel(uv, c);

    // Return scaled wavelength samples corresponding to RGB
    RGBIlluminantSpectrum s(*imageColorSpace, ClampZero(rgb));
    return scale * s.Sample(lambda);
}